

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::Serialize(Parser *this)

{
  FlatBufferBuilder *this_00;
  string *project;
  StructDef *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  __last;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  __last_00;
  Offset<flatbuffers::String> OVar3;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  included_filenames;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_> fbs_files;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_> objects;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_> enums;
  Offset<flatbuffers::String> file_ext;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> services;
  Offset<reflection::Schema> root;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  _Self __tmp;
  Offset<reflection::Object> root_table;
  _Self __tmp_1;
  pointer ppSVar9;
  pointer ppEVar10;
  pointer ppSVar11;
  Offset<flatbuffers::String> local_12c;
  Offset<reflection::Object> offset;
  undefined4 uStack_124;
  size_t local_120;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  included_files;
  vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
  schema_files;
  vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  service_offsets;
  vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  enum_offsets;
  vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  object_offsets;
  
  this_00 = &this->builder_;
  FlatBufferBuilderImpl<false>::Clear(this_00);
  std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::vector
            ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)&files,
             &(this->structs_).vec);
  __last._M_current._4_4_ = files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  __last._M_current._0_4_ = files._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  std::
  __sort<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::StructDef_const*,flatbuffers::StructDef_const*)>>
            ((__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              )files._M_t._M_impl._0_8_,__last,
             (_Iter_comp_iter<bool_(*)(const_flatbuffers::StructDef_*,_const_flatbuffers::StructDef_*)>
              )0x11a7cb);
  uVar6 = (ulong)(CONCAT44(files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                           files._M_t._M_impl.super__Rb_tree_header._M_header._M_color) -
                 files._M_t._M_impl._0_8_) >> 3;
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    *(int *)(*(long *)(files._M_t._M_impl._0_8_ + uVar8 * 8) + 0xb4) = (int)uVar8;
  }
  std::_Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
  ~_Vector_base((_Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *
                )&files);
  std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::vector
            ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)&files,
             &(this->enums_).vec);
  __last_00._M_current._4_4_ = files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  __last_00._M_current._0_4_ = files._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  std::
  __sort<__gnu_cxx::__normal_iterator<flatbuffers::EnumDef**,std::vector<flatbuffers::EnumDef*,std::allocator<flatbuffers::EnumDef*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::EnumDef_const*,flatbuffers::EnumDef_const*)>>
            ((__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              )files._M_t._M_impl._0_8_,__last_00,
             (_Iter_comp_iter<bool_(*)(const_flatbuffers::EnumDef_*,_const_flatbuffers::EnumDef_*)>)
             0x11a849);
  uVar6 = (ulong)(CONCAT44(files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                           files._M_t._M_impl.super__Rb_tree_header._M_header._M_color) -
                 files._M_t._M_impl._0_8_) >> 3;
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    *(int *)(*(long *)(files._M_t._M_impl._0_8_ + uVar8 * 8) + 0xb4) = (int)uVar8;
  }
  std::_Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::~_Vector_base
            ((_Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)&files
            );
  object_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &files._M_t._M_impl.super__Rb_tree_header._M_header;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  object_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  object_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppSVar9 = (this->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar9 !=
      (this->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar9 = ppSVar9 + 1) {
    offset = StructDef::Serialize(*ppSVar9,this_00,this);
    std::
    vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
    ::push_back(&object_offsets,&offset);
    pSVar1 = *ppSVar9;
    (pSVar1->super_Definition).serialized_location = offset.o;
    pbVar2 = (pSVar1->super_Definition).declaration_file;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&files,pbVar2);
    }
  }
  enum_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  enum_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enum_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppEVar10 = (this->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppEVar10 !=
      (this->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar10 = ppEVar10 + 1) {
    offset.o = (offset_type)EnumDef::Serialize(*ppEVar10,this_00,this);
    std::
    vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
    ::push_back(&enum_offsets,(value_type *)&offset);
    pbVar2 = ((*ppEVar10)->super_Definition).declaration_file;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&files,pbVar2);
    }
  }
  service_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  service_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  service_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppSVar11 = (this->services_).vec.
                  super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppSVar11 !=
      (this->services_).vec.
      super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar11 = ppSVar11 + 1) {
    offset.o = (offset_type)ServiceDef::Serialize(*ppSVar11,this_00,this);
    std::
    vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
    ::push_back(&service_offsets,(value_type *)&offset);
    pbVar2 = ((*ppSVar11)->super_Definition).declaration_file;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&files,pbVar2);
    }
  }
  if ((this->opts).project_root._M_string_length == 0) {
    fbs_files.o = 0;
  }
  else {
    project = &(this->opts).project_root;
    schema_files.
    super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    schema_files.
    super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    schema_files.
    super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    included_files.
    super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    included_files.
    super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    included_files.
    super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var5 = (this->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(this->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      FilePath((string *)&offset,project,(string *)(p_Var5 + 1),
               (this->opts).binary_schema_absolute_paths);
      OVar3 = FlatBufferBuilderImpl<false>::CreateSharedString
                        (this_00,(char *)CONCAT44(uStack_124,offset.o),local_120);
      std::__cxx11::string::~string((string *)&offset);
      for (p_Var4 = p_Var5[2]._M_right; p_Var4 != (_Rb_tree_node_base *)&p_Var5[2]._M_parent;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        FilePath((string *)&offset,project,(string *)(p_Var4 + 2),
                 (this->opts).binary_schema_absolute_paths);
        local_12c = FlatBufferBuilderImpl<false>::CreateSharedString
                              (this_00,(char *)CONCAT44(uStack_124,offset.o),local_120);
        std::
        vector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
        ::emplace_back<flatbuffers::Offset<flatbuffers::String>>
                  ((vector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
                    *)&included_files,&local_12c);
        std::__cxx11::string::~string((string *)&offset);
      }
      included_filenames =
           FlatBufferBuilderImpl<false>::
           CreateVector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
                     (this_00,&included_files);
      if (included_files.
          super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          included_files.
          super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        included_files.
        super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             included_files.
             super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      offset.o = (offset_type)reflection::CreateSchemaFile(this_00,OVar3,included_filenames);
      std::
      vector<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
      ::emplace_back<flatbuffers::Offset<reflection::SchemaFile>>
                ((vector<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
                  *)&schema_files,(Offset<reflection::SchemaFile> *)&offset);
    }
    fbs_files = FlatBufferBuilderImpl<false>::
                CreateVectorOfSortedTables<reflection::SchemaFile,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
                          (this_00,&schema_files);
    std::
    _Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::~_Vector_base(&included_files.
                     super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                   );
    std::
    _Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ::~_Vector_base(&schema_files.
                     super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
                   );
  }
  objects = FlatBufferBuilderImpl<false>::
            CreateVectorOfSortedTables<reflection::Object,std::allocator<flatbuffers::Offset<reflection::Object>>>
                      (this_00,&object_offsets);
  enums = FlatBufferBuilderImpl<false>::
          CreateVectorOfSortedTables<reflection::Enum,std::allocator<flatbuffers::Offset<reflection::Enum>>>
                    (this_00,&enum_offsets);
  OVar3 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                    (this_00,&this->file_identifier_);
  file_ext = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                       (this_00,&this->file_extension_);
  services = FlatBufferBuilderImpl<false>::
             CreateVectorOfSortedTables<reflection::Service,std::allocator<flatbuffers::Offset<reflection::Service>>>
                       (this_00,&service_offsets);
  if (this->root_struct_def_ == (StructDef *)0x0) {
    root_table.o = 0;
  }
  else {
    root_table.o = (this->root_struct_def_->super_Definition).serialized_location;
  }
  root = reflection::CreateSchema
                   (this_00,objects,enums,OVar3,file_ext,root_table,services,
                    (AdvancedFeatures)this->advanced_features_,fbs_files);
  if ((this->opts).size_prefixed == true) {
    FlatBufferBuilderImpl<false>::FinishSizePrefixed<reflection::Schema>(this_00,root,"BFBS");
  }
  else {
    FlatBufferBuilderImpl<false>::Finish<reflection::Schema>(this_00,root,"BFBS");
  }
  std::
  _Vector_base<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ::~_Vector_base(&service_offsets.
                   super__Vector_base<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
                 );
  std::
  _Vector_base<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ::~_Vector_base(&enum_offsets.
                   super__Vector_base<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
                 );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&files._M_t);
  std::
  _Vector_base<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ::~_Vector_base(&object_offsets.
                   super__Vector_base<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
                 );
  return;
}

Assistant:

void Parser::Serialize() {
  builder_.Clear();
  AssignIndices(structs_.vec);
  AssignIndices(enums_.vec);
  std::vector<Offset<reflection::Object>> object_offsets;
  std::set<std::string> files;
  for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    object_offsets.push_back(offset);
    (*it)->serialized_location = offset.o;
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Enum>> enum_offsets;
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    enum_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Service>> service_offsets;
  for (auto it = services_.vec.begin(); it != services_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    service_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }

  // Create Schemafiles vector of tables.
  flatbuffers::Offset<
      flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>>>
      schema_files__;
  if (!opts.project_root.empty()) {
    std::vector<Offset<reflection::SchemaFile>> schema_files;
    std::vector<Offset<flatbuffers::String>> included_files;
    for (auto f = files_included_per_file_.begin();
         f != files_included_per_file_.end(); f++) {

      const auto filename__ = builder_.CreateSharedString(FilePath(
          opts.project_root, f->first, opts.binary_schema_absolute_paths));
      for (auto i = f->second.begin(); i != f->second.end(); i++) {
        included_files.push_back(builder_.CreateSharedString(
            FilePath(opts.project_root, i->filename, opts.binary_schema_absolute_paths)));
      }
      const auto included_files__ = builder_.CreateVector(included_files);
      included_files.clear();

      schema_files.push_back(
          reflection::CreateSchemaFile(builder_, filename__, included_files__));
    }
    schema_files__ = builder_.CreateVectorOfSortedTables(&schema_files);
  }

  const auto objs__ = builder_.CreateVectorOfSortedTables(&object_offsets);
  const auto enum__ = builder_.CreateVectorOfSortedTables(&enum_offsets);
  const auto fiid__ = builder_.CreateString(file_identifier_);
  const auto fext__ = builder_.CreateString(file_extension_);
  const auto serv__ = builder_.CreateVectorOfSortedTables(&service_offsets);
  const auto schema_offset = reflection::CreateSchema(
      builder_, objs__, enum__, fiid__, fext__,
      (root_struct_def_ ? root_struct_def_->serialized_location : 0), serv__,
      static_cast<reflection::AdvancedFeatures>(advanced_features_),
      schema_files__);
  if (opts.size_prefixed) {
    builder_.FinishSizePrefixed(schema_offset, reflection::SchemaIdentifier());
  } else {
    builder_.Finish(schema_offset, reflection::SchemaIdentifier());
  }
}